

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string_convert.cpp
# Opt level: O2

StringBuilder * __thiscall Potassco::StringBuilder::append_(StringBuilder *this,uint64_t n,bool pos)

{
  ulong uVar1;
  undefined7 in_register_00000011;
  uint uVar2;
  ulong uVar3;
  char temp [22];
  
  uVar1 = -n;
  if ((int)CONCAT71(in_register_00000011,pos) != 0) {
    uVar1 = n;
  }
  uVar2 = 0x14;
  while( true ) {
    uVar3 = (ulong)(uVar2 + 1);
    if (uVar1 < 10) break;
    temp[uVar2 + 1] = (byte)(uVar1 % 10) | 0x30;
    uVar2 = uVar2 - 1;
    uVar1 = uVar1 / 10;
  }
  temp[uVar3] = (byte)uVar1 | 0x30;
  if (!pos) {
    uVar3 = (ulong)uVar2;
    temp[uVar3] = '-';
  }
  append(this,temp + uVar3,0x16 - uVar3);
  return this;
}

Assistant:

StringBuilder& StringBuilder::append_(uint64_t n, bool pos) {
	char temp[22];
	if (!pos) { n = ~n + 1; }
	uint32_t p = static_cast<uint32_t>(sizeof(temp) - 1);
	while (n >= 10) {
		uint64_t const q = n / 10;
		uint32_t const r = static_cast<uint32_t>(n % 10);
		temp[p--] = static_cast<char>('0' + r);
		n = q;
	}
	temp[p] = static_cast<char>(static_cast<uint32_t>(n) + '0');
	if (!pos) { temp[--p] = '-'; }
	return append(temp + p, sizeof(temp) - p);
}